

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O1

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  UInt UVar4;
  ostream *poVar5;
  Value *pVVar6;
  size_t in_RCX;
  undefined1 auVar7 [8];
  const_iterator cVar8;
  signalReferences_t signalReferences;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  pointer local_88 [3];
  undefined1 local_70 [16];
  _Rb_tree_node_base local_60;
  ValueIteratorBase local_40;
  
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)streamMetaFile,(method->_M_dataplus)._M_p,method->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  Json::FastWriter::FastWriter((FastWriter *)local_70);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_98,(int)(FastWriter *)local_70,params,in_RCX);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_98,(long)_Stack_90._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_98 != (undefined1  [8])local_88) {
    operator_delete((void *)local_98);
  }
  Json::FastWriter::~FastWriter((FastWriter *)local_70);
  iVar3 = std::__cxx11::string::compare((char *)method);
  if (iVar3 == 0) {
    local_98 = (undefined1  [8])0x0;
    _Stack_90._M_p = (pointer)0x0;
    local_88[0] = (pointer)0x0;
    cVar8 = Json::Value::begin(params);
    local_40.current_ = cVar8.super_ValueIteratorBase.current_._M_node;
    local_40.isNull_ = cVar8.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar8 = Json::Value::end(params);
      local_70._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
      local_70[8] = cVar8.super_ValueIteratorBase.isNull_;
      bVar2 = Json::ValueIteratorBase::isEqual(&local_40,(SelfType *)local_70);
      if (bVar2) break;
      pVVar6 = Json::ValueIteratorBase::deref(&local_40);
      Json::Value::asString_abi_cxx11_((string *)local_70,pVVar6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_98,
                 (string *)local_70);
      if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_);
      }
      Json::ValueIteratorBase::increment(&local_40);
    }
    hbm::streaming::StreamClient::subscribe(stream,(signalReferences_t *)local_98);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The following ",0xe);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," signal(s) were subscribed: ",0x1c);
    auVar7 = local_98;
    if (local_98 != (undefined1  [8])_Stack_90._M_p) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)*(_func_int **)auVar7,
                            (long)((_Base_ptr)auVar7)->_M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' ",2);
        auVar7 = (undefined1  [8])((long)auVar7 + 0x20);
      } while (auVar7 != (undefined1  [8])_Stack_90._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)method);
    if (iVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"streamMetaInformationCb",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," the following signal(s) is(are) not available anymore: ",
                 0x38);
      cVar8 = Json::Value::begin(params);
      local_98 = (undefined1  [8])cVar8.super_ValueIteratorBase.current_._M_node;
      _Stack_90._M_p._0_1_ = cVar8.super_ValueIteratorBase.isNull_;
      cVar8 = Json::Value::end(params);
      local_70._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
      local_70[8] = cVar8.super_ValueIteratorBase.isNull_;
      bVar2 = Json::ValueIteratorBase::isEqual((ValueIteratorBase *)local_98,(SelfType *)local_70);
      if (!bVar2) {
        do {
          pVVar6 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_98);
          Json::Value::asString_abi_cxx11_((string *)local_70,pVVar6);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_70._0_8_,
                              CONCAT71(local_70._9_7_,local_70[8]));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
            operator_delete((void *)local_70._0_8_);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)local_98);
          cVar8 = Json::Value::end(params);
          local_70._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
          local_70[8] = cVar8.super_ValueIteratorBase.isNull_;
          bVar2 = Json::ValueIteratorBase::isEqual
                            ((ValueIteratorBase *)local_98,(SelfType *)local_70);
        } while (!bVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)method);
      if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)method), iVar3 == 0)) &&
         (bVar2 = Json::Value::empty(params), !bVar2)) {
        pVVar6 = Json::Value::operator[](params,0);
        UVar4 = Json::Value::asUInt(pVVar6);
        if (0x19 < UVar4) {
          pcVar1 = (stream->m_address)._M_dataplus._M_p;
          local_70._0_8_ = &local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,pcVar1,pcVar1 + (stream->m_address)._M_string_length);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_70._0_8_,
                              CONCAT71(local_70._9_7_,local_70[8]));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,": ring buffer fill level is ",0x1c);
          pVVar6 = Json::Value::operator[](params,0);
          Json::Value::asUInt(pVVar6);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%",1);
          std::endl<char,std::char_traits<char>>(poVar5);
          if ((_Rb_tree_node_base *)local_70._0_8_ != &local_60) {
            operator_delete((void *)local_70._0_8_);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	streamMetaFile << method << ": " << Json::FastWriter().write(params) << std::endl;
	if (method == hbm::streaming::META_METHOD_AVAILABLE) {
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			signalReferences.push_back(element.asString());
		}

		try {
			stream.subscribe(signalReferences);
			std::cout << "The following " << signalReferences.size() << " signal(s) were subscribed: ";
			for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
				std::cout << "'" << *iter << "' ";
			}
			std::cout << std::endl;
		} catch(const std::runtime_error& e) {
			std::cerr << __FUNCTION__ << " error '" << e.what() << "' subscribing the following signal(s): ";
		}
	} else if(method==hbm::streaming::META_METHOD_UNAVAILABLE) {
		std::cout << __FUNCTION__ << " the following signal(s) is(are) not available anymore: ";

		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
		}
		std::cout << std::endl;
	} else if(method==hbm::streaming::META_METHOD_ALIVE) {
		// We do ignore this. We are using TCP keep alive in order to detect communication problems.
	} else if(method==hbm::streaming::META_METHOD_FILL) {
		if(params.empty()==false) {
			unsigned int fill = params[0u].asUInt();
			if(fill>25) {
				std::cout << stream.address() << ": ring buffer fill level is " << params[0u].asUInt() << "%" << std::endl;
			}
		}
	}
}